

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O0

void sprint(smat *m,char *caption,uint st,int ch,FILE *d)

{
  re_guts *prVar1;
  bool bVar2;
  char *pcVar3;
  uint local_34;
  int first;
  int i;
  re_guts *g;
  FILE *d_local;
  int ch_local;
  uint st_local;
  char *caption_local;
  smat *m_local;
  
  prVar1 = m->g;
  bVar2 = true;
  if ((m->eflags & 0x100U) != 0) {
    fprintf((FILE *)d,"%s",caption);
    if (ch != 0) {
      pcVar3 = pchar(ch);
      fprintf((FILE *)d," %s",pcVar3);
    }
    for (local_34 = 0; (long)(int)local_34 < prVar1->nstates; local_34 = local_34 + 1) {
      if ((st & 1 << ((byte)local_34 & 0x1f)) != 0) {
        pcVar3 = ", ";
        if (bVar2) {
          pcVar3 = "\t";
        }
        fprintf((FILE *)d,"%s%d",pcVar3,(ulong)local_34);
        bVar2 = false;
      }
    }
    fprintf((FILE *)d,"\n");
  }
  return;
}

Assistant:

static void
print(m, caption, st, ch, d)
struct match *m;
char *caption;
states st;
int ch;
FILE *d;
{
	struct re_guts *g = m->g;
	int i;
	int first = 1;

	if (!(m->eflags&REG_TRACE))
		return;

	fprintf(d, "%s", caption);
	if (ch != '\0')
		fprintf(d, " %s", pchar(ch));
	for (i = 0; i < g->nstates; i++)
		if (ISSET(st, i)) {
			fprintf(d, "%s%d", (first) ? "\t" : ", ", i);
			first = 0;
		}
	fprintf(d, "\n");
}